

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

void aom_noise_model_save_latest(aom_noise_model_t *noise_model)

{
  long in_RDI;
  int c;
  aom_equation_system_t *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    equation_system_copy
              ((aom_equation_system_t *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
    equation_system_copy
              ((aom_equation_system_t *)CONCAT44(iVar1,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
    *(undefined4 *)(in_RDI + (long)iVar1 * 0x70 + 100) =
         *(undefined4 *)(in_RDI + (long)iVar1 * 0x70 + 0x1b4);
    *(undefined4 *)(in_RDI + (long)iVar1 * 0x70 + 0x70) =
         *(undefined4 *)(in_RDI + (long)iVar1 * 0x70 + 0x1c0);
    *(undefined8 *)(in_RDI + (long)iVar1 * 0x70 + 0x78) =
         *(undefined8 *)(in_RDI + (long)iVar1 * 0x70 + 0x1c8);
  }
  return;
}

Assistant:

void aom_noise_model_save_latest(aom_noise_model_t *noise_model) {
  for (int c = 0; c < 3; c++) {
    equation_system_copy(&noise_model->combined_state[c].eqns,
                         &noise_model->latest_state[c].eqns);
    equation_system_copy(&noise_model->combined_state[c].strength_solver.eqns,
                         &noise_model->latest_state[c].strength_solver.eqns);
    noise_model->combined_state[c].strength_solver.num_equations =
        noise_model->latest_state[c].strength_solver.num_equations;
    noise_model->combined_state[c].num_observations =
        noise_model->latest_state[c].num_observations;
    noise_model->combined_state[c].ar_gain =
        noise_model->latest_state[c].ar_gain;
  }
}